

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O3

spki_record * create_record(int ASN,int ski_offset,int spki_offset,rtr_socket *socket)

{
  long lVar1;
  undefined1 auVar2 [16];
  spki_record *psVar3;
  long lVar4;
  long in_FS_OFFSET;
  long lVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = (spki_record *)calloc(1,0x80);
  psVar3->asn = ASN;
  auVar2 = _DAT_00109020;
  lVar4 = 4;
  auVar9 = _DAT_00109010;
  do {
    auVar8 = auVar9 ^ auVar2;
    if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffffb) {
      *(int *)(psVar3->ski + lVar4 + -4) = ski_offset;
      *(int *)(psVar3->ski + lVar4) = ski_offset + 1;
    }
    lVar5 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar5 + 2;
    lVar4 = lVar4 + 8;
    ski_offset = ski_offset + 2;
  } while (lVar4 != 0x1c);
  lVar4 = 0x1c;
  iVar6 = (int)DAT_00109050;
  iVar7 = DAT_00109050._4_4_;
  auVar8 = _DAT_00109010;
  do {
    auVar9 = auVar8 ^ auVar2;
    if (auVar9._4_4_ == iVar7 && auVar9._0_4_ < iVar6) {
      *(int *)(psVar3->ski + lVar4 + -4) = spki_offset;
      *(int *)(psVar3->ski + lVar4) = spki_offset + 1;
    }
    lVar5 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar5 + 2;
    lVar4 = lVar4 + 8;
    spki_offset = spki_offset + 2;
  } while (lVar4 != 0x74);
  psVar3->socket = socket;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return psVar3;
}

Assistant:

static struct spki_record *create_record(int ASN, int ski_offset, int spki_offset, struct rtr_socket *socket)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));
	uint32_t i;

	memset(record, 0, sizeof(*record));
	record->asn = ASN;

	for (i = 0; i < sizeof(record->ski) / sizeof(uint32_t); i++)
		((uint32_t *)record->ski)[i] = i + ski_offset;

	for (i = 0; i < sizeof(record->spki) / sizeof(uint32_t); i++)
		((uint32_t *)record->spki)[i] = i + spki_offset;

	record->socket = socket;
	return record;
}